

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O3

void __thiscall trng::mt19937::seed(mt19937 *this,unsigned_long s)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  (this->S).mt[0] = (result_type)s;
  (this->S).mti = 1;
  iVar3 = 1;
  do {
    uVar1 = (this->S).mt[(long)iVar3 + -1];
    (this->S).mt[iVar3] = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + iVar3;
    iVar2 = (this->S).mti;
    iVar3 = iVar2 + 1;
    (this->S).mti = iVar3;
  } while (iVar2 < 0x26f);
  return;
}

Assistant:

void mt19937::seed(unsigned long s) {
    S.mt[0] = s & 0xffffffffU;
    for (S.mti = 1; S.mti < mt19937::N; ++S.mti)
      S.mt[S.mti] =
          (1812433253U * (S.mt[S.mti - 1] ^ (S.mt[S.mti - 1] >> 30u)) + S.mti) & 0xffffffffU;
  }